

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O2

void __thiscall
vkt::sr::anon_unknown_0::TextureGatherCubeCase::initPrograms
          (TextureGatherCubeCase *this,SourceCollections *dst)

{
  GatherType gatherType;
  OffsetSize OVar1;
  _Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  *this_00;
  pointer this_01;
  OffsetSize OVar2;
  allocator_type *__a;
  GatherArgs *__cur;
  _Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  local_68;
  vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  iterations;
  
  gatherType = (this->m_baseParams).gatherType;
  __a = (allocator_type *)(ulong)gatherType;
  OVar1 = (this->m_baseParams).offsetSize;
  OVar2 = OVar1;
  if (OVar1 != OFFSETSIZE_NONE) {
    if (OVar1 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
      local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      goto LAB_0062d677;
    }
    if (OVar1 == OFFSETSIZE_MINIMUM_REQUIRED) {
      OVar1 = 0xfffffff8;
      OVar2 = 7;
    }
    else {
      OVar1 = ~OFFSETSIZE_NONE;
      OVar2 = OVar1;
    }
  }
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(OVar2,OVar1);
LAB_0062d677:
  generateCubeCaseIterations
            (&iterations,gatherType,&(this->m_baseParams).textureFormat,(IVec2 *)&local_68);
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (_Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
             *)(((long)iterations.
                       super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)iterations.
                      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x28);
  std::
  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  ::_S_check_init_len((size_type)this_00,__a);
  this_01 = std::
            _Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
            ::_M_allocate(this_00,(size_t)__a);
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = this_01 + (long)this_00;
  local_68._M_impl.super__Vector_impl_data._M_start = this_01;
  for (; iterations.
         super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         iterations.
         super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      iterations.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
      ._M_impl.super__Vector_impl_data._M_start =
           iterations.
           super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    GatherArgs::GatherArgs
              (this_01,&(iterations.
                         super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                         ._M_impl.super__Vector_impl_data._M_start)->gatherArgs);
    this_01 = this_01 + 1;
  }
  local_68._M_impl.super__Vector_impl_data._M_finish = this_01;
  genGatherPrograms(dst,&this->m_baseParams,
                    (vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                     *)&local_68);
  std::
  _Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  ::~_Vector_base(&local_68);
  std::
  _Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  ::~_Vector_base(&iterations.
                   super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                 );
  return;
}

Assistant:

void TextureGatherCubeCase::initPrograms (vk::SourceCollections& dst) const
{
	const vector<GatherCubeArgs>	iterations	= generateCubeCaseIterations(m_baseParams.gatherType,
																			 m_baseParams.textureFormat,
																			 m_baseParams.offsetSize != OFFSETSIZE_IMPLEMENTATION_MAXIMUM ? getOffsetRange(m_baseParams.offsetSize) : IVec2(0));

	genGatherPrograms(dst, m_baseParams, vector<GatherArgs>(iterations.begin(), iterations.end()));
}